

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

void __thiscall r_comp::Image::add_object(Image *this,Code *object)

{
  uint uVar1;
  iterator iVar2;
  bool bVar3;
  vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_> *this_00;
  size_type sVar4;
  mapped_type *pmVar5;
  SysObject *this_01;
  Code *pCVar6;
  Code *object_00;
  long lVar7;
  uint *puVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  uintptr_t _object;
  Code *reference;
  size_t i;
  size_t reference_count;
  SysObject *sys_object;
  size_t object_index;
  _Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false> local_20;
  iterator it;
  Code *object_local;
  Image *this_local;
  
  it.super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>._M_cur =
       (_Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>)
       (_Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>)object;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<r_code::Code_*,_unsigned_long,_std::hash<r_code::Code_*>,_std::equal_to<r_code::Code_*>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>_>
       ::find(&this->ptrs_to_indices,(key_type *)&it);
  object_index = (size_t)std::
                         unordered_map<r_code::Code_*,_unsigned_long,_std::hash<r_code::Code_*>,_std::equal_to<r_code::Code_*>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>_>
                         ::end(&this->ptrs_to_indices);
  bVar3 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false> *)
                     &object_index);
  if (!bVar3) {
    this_00 = r_code::vector<r_code::SysObject_*>::as_std(&(this->code_segment).objects);
    sVar4 = std::vector<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>::size(this_00);
    pmVar5 = std::
             unordered_map<r_code::Code_*,_unsigned_long,_std::hash<r_code::Code_*>,_std::equal_to<r_code::Code_*>,_std::allocator<std::pair<r_code::Code_*const,_unsigned_long>_>_>
             ::operator[](&this->ptrs_to_indices,(key_type *)&it);
    *pmVar5 = sVar4;
    this_01 = (SysObject *)operator_new(0x70);
    r_code::SysObject::SysObject
              (this_01,(Code *)it.
                               super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>
                               ._M_cur);
    add_sys_object(this,this_01);
    pCVar6 = (Code *)get_reference_count(this,(Code *)it.
                                                  super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>
                                                  ._M_cur);
    uVar9 = extraout_RDX;
    for (reference = (Code *)0x0;
        iVar2.super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>._M_cur
             = it.super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>.
               _M_cur, reference < pCVar6; reference = reference + 1) {
      object_00 = (Code *)(**(code **)(*(long *)it.
                                                super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>
                                                ._M_cur + 0x48))
                                    (it.
                                     super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>
                                     ._M_cur,(ulong)reference & 0xffff,uVar9,
                                     (ulong)reference & 0xffff);
      lVar7 = (**(code **)(*(long *)object_00 + 0x10))();
      if (lVar7 == 0xffffffff) {
LAB_001c1b3d:
        add_object(this,object_00);
        uVar9 = extraout_RDX_00;
      }
      else {
        auVar10 = (**(code **)(*(long *)object_00 + 0x70))();
        uVar9 = auVar10._8_8_;
        if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_001c1b3d;
      }
    }
    uVar1 = (uint)it.super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>
                  ._M_cur;
    puVar8 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(this_01 + 0x20),0);
    *puVar8 = uVar1;
    puVar8 = r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(this_01 + 0x20),1);
    *puVar8 = iVar2.super__Node_iterator_base<std::pair<r_code::Code_*const,_unsigned_long>,_false>.
              _M_cur._4_4_;
  }
  return;
}

Assistant:

void Image::add_object(Code *object)
{
    std::unordered_map<Code *, size_t>::iterator it = ptrs_to_indices.find(object);

    if (it != ptrs_to_indices.end()) { // object already there.
        return;
    }

    size_t object_index;
    ptrs_to_indices[object] = object_index = code_segment.objects.as_std()->size();
    SysObject *sys_object = new SysObject(object);
    add_sys_object(sys_object);
    size_t reference_count = get_reference_count(object);

    for (size_t i = 0; i < reference_count; ++i) { // follow reference pointers and recurse.
        Code *reference = object->get_reference(i);

        if (reference->get_oid() == UNDEFINED_OID ||
            reference->is_invalidated()) { // the referenced object is not in the image and will not be added otherwise.
            add_object(reference);
        }
    }

    uintptr_t _object = (uintptr_t)object;
    sys_object->references[0] = (_object & UINT32_MAX);
    sys_object->references[1] = (_object >> 32);
}